

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::EntryPushNonJavascriptArray
              (ScriptContext *scriptContext,Var *args,uint argCount)

{
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags IVar3;
  BOOL BVar4;
  uint32 uVar5;
  ThreadContext *pTVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  ScriptConfiguration *this;
  uint64 initIndex;
  Var newValue;
  uint64 local_210;
  bool local_17d;
  BOOL setLength_1;
  Var lengthAsNUmberVar;
  BOOL setLength;
  BOOL setItem_1;
  BigIndex big;
  undefined1 local_e0 [4];
  BOOL setItem;
  uint local_cc;
  undefined1 auStack_c8 [4];
  uint index;
  uint64 local_c0;
  BigIndex local_b8;
  undefined1 local_a8 [8];
  BigIndex n;
  ThrowTypeErrorOnFailureHelper h;
  Var length;
  RecyclableObject *local_68;
  RecyclableObject *obj;
  JsReentLock jsReentLock;
  uint argCount_local;
  Var *args_local;
  ScriptContext *scriptContext_local;
  TypeId local_18;
  TypeId typeId;
  
  jsReentLock._28_4_ = argCount;
  pTVar6 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&obj,pTVar6);
  local_68 = (RecyclableObject *)0x0;
  BVar4 = JavascriptConversion::ToObject(*args,scriptContext,&local_68);
  if (BVar4 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,L"Array.prototype.push");
  }
  JsReentLock::setObjectForMutation((JsReentLock *)&obj,local_68);
  JsReentLock::unlock((JsReentLock *)&obj);
  scriptContext_local =
       (ScriptContext *)Js::JavascriptOperators::OP_GetLength(local_68,scriptContext);
  if (scriptContext_local == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = TaggedInt::Is(scriptContext_local);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(scriptContext_local);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(scriptContext_local);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(pRVar8);
      if ((0x57 < (int)local_18) && (BVar4 = RecyclableObject::IsExternal(pRVar8), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
  }
  if (local_18 == TypeIds_Undefined) {
    pTVar6 = ScriptContext::GetThreadContext(scriptContext);
    bVar2 = ThreadContext::IsDisableImplicitCall(pTVar6);
    if (bVar2) {
      pTVar6 = ScriptContext::GetThreadContext(scriptContext);
      IVar3 = ThreadContext::GetImplicitCallFlags(pTVar6);
      if (IVar3 != ImplicitCall_None) goto LAB_010d16af;
    }
  }
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailureHelper
            ((ThrowTypeErrorOnFailureHelper *)&n.bigIndex,scriptContext,L"Array.prototype.push");
  BigIndex::BigIndex((BigIndex *)local_a8,0);
  this = ScriptContext::GetConfig(scriptContext);
  bVar2 = ScriptConfiguration::IsES6ToLengthEnabled(this);
  if (bVar2) {
    initIndex = JavascriptConversion::ToLength(scriptContext_local,scriptContext);
    BigIndex::BigIndex(&local_b8,initIndex);
    local_a8 = (undefined1  [8])local_b8._0_8_;
    n._0_8_ = local_b8.bigIndex;
  }
  else {
    uVar5 = JavascriptConversion::ToUInt32(scriptContext_local,scriptContext);
    BigIndex::BigIndex((BigIndex *)auStack_c8,uVar5);
    local_a8 = (undefined1  [8])_auStack_c8;
    n._0_8_ = local_c0;
  }
  local_cc = 1;
  while( true ) {
    local_17d = false;
    if (local_cc < (uint)jsReentLock._28_4_) {
      BigIndex::BigIndex((BigIndex *)local_e0,0xffffffff);
      local_17d = BigIndex::operator<((BigIndex *)local_a8,(BigIndex *)local_e0);
    }
    if (local_17d == false) break;
    JsReentLock::unlock((JsReentLock *)&obj);
    pRVar8 = local_68;
    uVar5 = BigIndex::GetSmallIndex((BigIndex *)local_a8);
    big.bigIndex._4_4_ =
         Js::JavascriptOperators::SetItem
                   (pRVar8,pRVar8,uVar5,args[local_cc],scriptContext,
                    PropertyOperation_ThrowIfNotExtensible,0);
    JsReentLock::MutateArrayObject((JsReentLock *)&obj);
    JsReentLock::relock((JsReentLock *)&obj);
    BVar4 = ThrowTypeErrorOnFailureHelper::IsThrowTypeError
                      ((ThrowTypeErrorOnFailureHelper *)&n.bigIndex,big.bigIndex._4_4_);
    if (BVar4 != 0) {
      pTVar6 = ScriptContext::GetThreadContext(scriptContext);
      bVar2 = ThreadContext::RecordImplicitException(pTVar6);
      if (!bVar2) {
        scriptContext_local = (ScriptContext *)0x0;
        goto LAB_010d16af;
      }
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)&n.bigIndex);
    }
    local_cc = local_cc + 1;
    BigIndex::operator++((BigIndex *)local_a8);
  }
  if (local_cc < (uint)jsReentLock._28_4_) {
    _setLength = local_a8;
    big.index = n.index;
    big._4_4_ = n._4_4_;
    while (local_cc < (uint)jsReentLock._28_4_) {
      JsReentLock::unlock((JsReentLock *)&obj);
      BVar4 = BigIndex::SetItem((BigIndex *)&setLength,local_68,args[local_cc],
                                PropertyOperation_ThrowIfNotExtensible);
      JsReentLock::MutateArrayObject((JsReentLock *)&obj);
      JsReentLock::relock((JsReentLock *)&obj);
      BVar4 = ThrowTypeErrorOnFailureHelper::IsThrowTypeError
                        ((ThrowTypeErrorOnFailureHelper *)&n.bigIndex,BVar4);
      if (BVar4 != 0) {
        pTVar6 = ScriptContext::GetThreadContext(scriptContext);
        bVar2 = ThreadContext::RecordImplicitException(pTVar6);
        if (!bVar2) {
          scriptContext_local = (ScriptContext *)0x0;
          goto LAB_010d16af;
        }
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&n.bigIndex);
      }
      local_cc = local_cc + 1;
      BigIndex::operator++((BigIndex *)&setLength);
    }
    JsReentLock::unlock((JsReentLock *)&obj);
    pRVar8 = local_68;
    newValue = BigIndex::ToNumber((BigIndex *)&setLength,scriptContext);
    BVar4 = Js::JavascriptOperators::SetProperty
                      (pRVar8,pRVar8,0xd1,newValue,scriptContext,
                       PropertyOperation_ThrowIfNotExtensible);
    JsReentLock::MutateArrayObject((JsReentLock *)&obj);
    JsReentLock::relock((JsReentLock *)&obj);
    BVar4 = ThrowTypeErrorOnFailureHelper::IsThrowTypeError
                      ((ThrowTypeErrorOnFailureHelper *)&n.bigIndex,BVar4);
    if (BVar4 != 0) {
      pTVar6 = ScriptContext::GetThreadContext(scriptContext);
      bVar2 = ThreadContext::RecordImplicitException(pTVar6);
      if (!bVar2) {
        scriptContext_local = (ScriptContext *)0x0;
        goto LAB_010d16af;
      }
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)&n.bigIndex);
    }
    scriptContext_local = (ScriptContext *)BigIndex::ToNumber((BigIndex *)&setLength,scriptContext);
  }
  else {
    bVar2 = BigIndex::IsSmallIndex((BigIndex *)local_a8);
    if (bVar2) {
      uVar5 = BigIndex::GetSmallIndex((BigIndex *)local_a8);
      local_210 = (uint64)uVar5;
    }
    else {
      local_210 = BigIndex::GetBigIndex((BigIndex *)local_a8);
    }
    scriptContext_local = (ScriptContext *)JavascriptNumber::ToVar(local_210,scriptContext);
    JsReentLock::unlock((JsReentLock *)&obj);
    BVar4 = Js::JavascriptOperators::SetProperty
                      (local_68,local_68,0xd1,scriptContext_local,scriptContext,
                       PropertyOperation_ThrowIfNotExtensible);
    JsReentLock::MutateArrayObject((JsReentLock *)&obj);
    JsReentLock::relock((JsReentLock *)&obj);
    BVar4 = ThrowTypeErrorOnFailureHelper::IsThrowTypeError
                      ((ThrowTypeErrorOnFailureHelper *)&n.bigIndex,BVar4);
    if (BVar4 != 0) {
      pTVar6 = ScriptContext::GetThreadContext(scriptContext);
      bVar2 = ThreadContext::RecordImplicitException(pTVar6);
      if (bVar2) {
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&n.bigIndex);
      }
      else {
        scriptContext_local = (ScriptContext *)0x0;
      }
    }
  }
LAB_010d16af:
  JsReentLock::~JsReentLock((JsReentLock *)&obj);
  return scriptContext_local;
}

Assistant:

Var JavascriptArray::EntryPushNonJavascriptArray(ScriptContext * scriptContext, Var * args, uint argCount)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        RecyclableObject* obj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.push"));
        }
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        JS_REENTRANT_UNLOCK(jsReentLock, Var length = JavascriptOperators::OP_GetLength(obj, scriptContext));
        if(JavascriptOperators::GetTypeId(length) == TypeIds_Undefined && scriptContext->GetThreadContext()->IsDisableImplicitCall() &&
            scriptContext->GetThreadContext()->GetImplicitCallFlags() != Js::ImplicitCall_None)
        {
            return length;
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));
        BigIndex n;
        if (scriptContext->GetConfig()->IsES6ToLengthEnabled())
        {
            n = (uint64) JavascriptConversion::ToLength(length, scriptContext);
        }
        else
        {
            n = JavascriptConversion::ToUInt32(length, scriptContext);
        }
        // First handle "small" indices.
        uint index;
        for (index=1; index < argCount && n < JavascriptArray::MaxArrayLength; ++index, ++n)
        {
            JS_REENTRANT(jsReentLock,
                BOOL setItem = JavascriptOperators::SetItem(obj, obj, n.GetSmallIndex(), args[index], scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setItem))
            {
                if (scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }
        }

        // Use BigIndex if we need to push indices >= MaxArrayLength
        if (index < argCount)
        {
            BigIndex big = n;

            for (; index < argCount; ++index, ++big)
            {
                JS_REENTRANT(jsReentLock, BOOL setItem = big.SetItem(obj, args[index], PropertyOperation_ThrowIfNotExtensible));
                if (h.IsThrowTypeError(setItem))
                {
                    if(scriptContext->GetThreadContext()->RecordImplicitException())
                    {
                        h.ThrowTypeErrorOnFailure();
                    }
                    else
                    {
                        return nullptr;
                    }
                }

            }

            // Set the new length; for objects it is all right for this to be >= MaxArrayLength
            JS_REENTRANT(jsReentLock,
                BOOL setLength = JavascriptOperators::SetProperty(obj, obj, PropertyIds::length, big.ToNumber(scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setLength))
            {
                if(scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }

            return big.ToNumber(scriptContext);
        }
        else
        {
            // Set the new length
            Var lengthAsNUmberVar = JavascriptNumber::ToVar(n.IsSmallIndex() ? n.GetSmallIndex() : n.GetBigIndex(), scriptContext);
            JS_REENTRANT(jsReentLock,
                BOOL setLength = JavascriptOperators::SetProperty(obj, obj, PropertyIds::length, lengthAsNUmberVar, scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setLength))
            {
                if(scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }

            return lengthAsNUmberVar;
        }
    }